

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioContextDemuxer.h
# Opt level: O2

void __thiscall MOVStreamContext::MOVStreamContext(MOVStreamContext *this)

{
  (this->super_Track).name = (char *)0x0;
  (this->super_Track).language[0] = '\0';
  (this->super_Track).language[1] = '\0';
  (this->super_Track).language[2] = '\0';
  (this->super_Track).language[3] = '\0';
  (this->super_Track).type = UNDEFINED;
  (this->super_Track).stream_index = 0;
  (this->super_Track).num = 0;
  (this->super_Track).uid = 0;
  (this->super_Track).codec_id = (char *)0x0;
  (this->super_Track).codec_name = (char *)0x0;
  *(undefined8 *)((long)&(this->super_Track).codec_name + 4) = 0;
  *(undefined8 *)((long)&(this->super_Track).codec_priv + 4) = 0;
  (this->super_Track).parsed_priv_data = (ParsedTrackPrivData *)0x0;
  (this->super_Track).default_duration = 0;
  (this->super_Track).encodingAlgo = 0;
  (this->super_Track).encodingAlgoPriv.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_Track).encodingAlgoPriv.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->super_Track).encodingAlgoPriv.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_Track).encodingAlgoPriv.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->chunk_offsets).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->chunk_offsets).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chunk_offsets).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_index).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_indexCur = 0;
  this->ffindex = 0;
  this->next_chunk = 0;
  this->ctts_count = 0;
  (this->stsc_data).super__Vector_base<MOVStsc,_std::allocator<MOVStsc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stsc_data).super__Vector_base<MOVStsc,_std::allocator<MOVStsc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stsc_data).super__Vector_base<MOVStsc,_std::allocator<MOVStsc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->fps = 0.0;
  this->ctts_index = 0;
  this->ctts_sample = 0;
  this->sample_size = 0;
  this->sample_count = 0;
  this->keyframe_count = 0;
  this->time_scale = 0;
  this->current_sample = 0;
  this->bytes_per_frame = 0;
  this->samples_per_frame = 0;
  this->pseudo_stream_id = 0;
  this->audio_cid = 0;
  this->width = 0;
  this->sample_rate = 0;
  this->height = 0;
  this->bits_per_coded_sample = 0;
  this->channels = 0;
  this->packet_size = 0;
  (this->ctts_data).super__Vector_base<MOVStts,_std::allocator<MOVStts>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ctts_data).super__Vector_base<MOVStts,_std::allocator<MOVStts>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stts_data).super__Vector_base<MOVStts,_std::allocator<MOVStts>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stts_data).super__Vector_base<MOVStts,_std::allocator<MOVStts>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->keyframes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->stts_data).super__Vector_base<MOVStts,_std::allocator<MOVStts>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keyframes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keyframes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ctts_data).super__Vector_base<MOVStts,_std::allocator<MOVStts>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Track() : num(0), uid(0), stream_index(0), codec_priv_size(0), flags(0)
    {
        name = codec_id = codec_name = nullptr;
        parsed_priv_data = nullptr;
        codec_priv = nullptr;
        memset(language, 0, sizeof(language));
        default_duration = 0;
        encodingAlgo = 0;
        type = IOContextTrackType::UNDEFINED;
    }